

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.c
# Opt level: O0

void clearAllBuffers(void)

{
  uint k;
  uint j;
  uint i;
  
  for (i = 0; i < 5; i = i + 1) {
    for (j = 0; j < 4; j = j + 1) {
      for (k = 0; k < 100; k = k + 1) {
        buf[i][j][k] = 9.1349043e-200;
      }
      for (; k < 0x1e0; k = k + 1) {
        buf[i][j][k] = 8.1489031e-158;
      }
    }
  }
  return;
}

Assistant:

void clearAllBuffers( void )
{
   unsigned int i,j,k;

   for( i=0; i < NB_GLOBAL_BUFFER; i++ )
   {
      for( j=0; j < TA_NB_OUT_IN; j++ )
      {
         for( k=0; k < TA_BUF_PREFIX; k++ )
            buf[i][j][k] = RESV_PATTERN_PREFIX;
         for( ; k < TA_BUF_SIZE; k++ )
            buf[i][j][k] = RESV_PATTERN_SUFFIX;
      }
   }
}